

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::GlobDirs
               (string *path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  long lVar4;
  Status SVar5;
  unsigned_long uVar6;
  char *pcVar7;
  uint uVar8;
  ulong dindex;
  bool bVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  Directory d;
  string startPath;
  string fname;
  string finishPath;
  allocator<char> local_121;
  Directory local_120;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  long local_108;
  undefined1 *puStack_100;
  size_t local_f8;
  char *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  string local_e0;
  string local_c0;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  long local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  lVar4 = std::__cxx11::string::find((char *)path,0x262692,0);
  if (lVar4 != -1) {
    local_e8 = files;
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)path);
    std::__cxx11::string::substr((ulong)local_a0,(ulong)path);
    cmsys::Directory::Directory(&local_120);
    SVar5 = cmsys::Directory::Load(&local_120,&local_e0,(string *)0x0);
    if (SVar5.Kind_ == Success) {
      uVar8 = 0;
      while( true ) {
        uVar6 = cmsys::Directory::GetNumberOfFiles(&local_120);
        dindex = (ulong)uVar8;
        if (uVar6 <= dindex) break;
        pcVar7 = cmsys::Directory::GetFile(&local_120,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,pcVar7,(allocator<char> *)&local_60);
        iVar3 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar3 == 0) {
          bVar9 = false;
        }
        else {
          pcVar7 = cmsys::Directory::GetFile(&local_120,dindex);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_80,pcVar7,&local_121);
          iVar3 = std::__cxx11::string::compare((char *)local_80);
          bVar9 = iVar3 != 0;
          if (local_80[0] != local_70) {
            operator_delete(local_80[0],local_70[0] + 1);
          }
        }
        if ((long *)local_118._M_len != &local_108) {
          operator_delete((void *)local_118._M_len,local_108 + 1);
        }
        sVar2 = local_e0._M_string_length;
        _Var1._M_p = local_e0._M_dataplus._M_p;
        if (bVar9) {
          local_60 = 1;
          puStack_58 = local_50;
          local_50[0] = 0x2f;
          pcVar7 = cmsys::Directory::GetFile(&local_120,dindex);
          local_118._M_len = sVar2;
          local_118._M_str = _Var1._M_p;
          local_108 = local_60;
          puStack_100 = puStack_58;
          local_f8 = strlen(pcVar7);
          views._M_len = 3;
          views._M_array = &local_118;
          local_f0 = pcVar7;
          cmCatViews_abi_cxx11_(&local_c0,views);
          bVar9 = cmsys::SystemTools::FileIsDirectory(&local_c0);
          files_00 = local_e8;
          if (bVar9) {
            std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0[0]);
            GlobDirs(&local_c0,files_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        uVar8 = uVar8 + 1;
      }
    }
    cmsys::Directory::~Directory(&local_120);
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(files,path);
  return;
}

Assistant:

void cmSystemTools::GlobDirs(const std::string& path,
                             std::vector<std::string>& files)
{
  std::string::size_type pos = path.find("/*");
  if (pos == std::string::npos) {
    files.push_back(path);
    return;
  }
  std::string startPath = path.substr(0, pos);
  std::string finishPath = path.substr(pos + 2);

  cmsys::Directory d;
  if (d.Load(startPath)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = cmStrCat(startPath, '/', d.GetFile(i));
        if (cmSystemTools::FileIsDirectory(fname)) {
          fname += finishPath;
          cmSystemTools::GlobDirs(fname, files);
        }
      }
    }
  }
}